

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::benchmarkEnded
          (ConsoleReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats)

{
  uint uVar1;
  element_type *peVar2;
  type pTVar3;
  TablePrinter *pTVar4;
  rep rVar5;
  Duration local_b8;
  Duration local_a0;
  Duration local_88;
  Duration local_70;
  Duration local_58;
  Duration local_40;
  Duration local_28;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *local_18;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats_local;
  ConsoleReporter *this_local;
  
  local_18 = stats;
  stats_local = (BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)this
  ;
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
  uVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0x15])();
  if ((uVar1 & 1) == 0) {
    pTVar3 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
             ::operator*(&this->m_tablePrinter);
    pTVar4 = Catch::operator<<(pTVar3);
    rVar5 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).point);
    anon_unknown_2::Duration::Duration(&local_40,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar4,&local_40);
    pTVar4 = Catch::operator<<(pTVar4);
    rVar5 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).lower_bound);
    anon_unknown_2::Duration::Duration(&local_58,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar4,&local_58);
    pTVar4 = Catch::operator<<(pTVar4);
    rVar5 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).upper_bound);
    anon_unknown_2::Duration::Duration(&local_70,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar4,&local_70);
    pTVar4 = Catch::operator<<(pTVar4);
    pTVar4 = Catch::operator<<(pTVar4);
    rVar5 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->standardDeviation).point);
    anon_unknown_2::Duration::Duration(&local_88,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar4,&local_88);
    pTVar4 = Catch::operator<<(pTVar4);
    rVar5 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->standardDeviation).lower_bound);
    anon_unknown_2::Duration::Duration(&local_a0,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar4,&local_a0);
    pTVar4 = Catch::operator<<(pTVar4);
    rVar5 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->standardDeviation).upper_bound);
    anon_unknown_2::Duration::Duration(&local_b8,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar4,&local_b8);
    pTVar4 = Catch::operator<<(pTVar4);
    pTVar4 = Catch::operator<<(pTVar4);
    pTVar4 = Catch::operator<<(pTVar4);
    pTVar4 = Catch::operator<<(pTVar4);
    Catch::operator<<(pTVar4);
  }
  else {
    pTVar3 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
             ::operator*(&this->m_tablePrinter);
    rVar5 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).point);
    anon_unknown_2::Duration::Duration(&local_28,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar3,&local_28);
    Catch::operator<<(pTVar4);
  }
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats<> const& stats) {
    if (m_config->benchmarkNoAnalysis())
    {
        (*m_tablePrinter) << Duration(stats.mean.point.count()) << ColumnBreak();
    }
    else
    {
        (*m_tablePrinter) << ColumnBreak()
            << Duration(stats.mean.point.count()) << ColumnBreak()
            << Duration(stats.mean.lower_bound.count()) << ColumnBreak()
            << Duration(stats.mean.upper_bound.count()) << ColumnBreak() << ColumnBreak()
            << Duration(stats.standardDeviation.point.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.lower_bound.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.upper_bound.count()) << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak();
    }
}